

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item::update_prev_next(Fl_Tree_Item *this,int index)

{
  int index_local;
  Fl_Tree_Item *this_local;
  
  return;
}

Assistant:

void Fl_Tree_Item::update_prev_next(int index) {
#if FLTK_ABI_VERSION >= 10301
  // NEW
  if ( index == -1 ) {	// special case: become an orphan
    _parent = 0;
    _prev_sibling = 0;
    _next_sibling = 0;
    return;
  }
  int pchildren = parent() ? parent()->children() : 0;
  int index_prev = index-1;
  int index_next = index+1;
  // Get pointers to prev+next items
  Fl_Tree_Item *item_prev = (index_prev>=0)&&(index_prev<pchildren) ? parent()->child(index_prev) : 0;
  Fl_Tree_Item *item_next = (index_next>=0)&&(index_next<pchildren) ? parent()->child(index_next) : 0;
  // Adjust our prev+next ptrs
  _prev_sibling = item_prev;
  _next_sibling = item_next;
  // Adjust neighbors to point to us
  if ( item_prev ) item_prev->_next_sibling = this;
  if ( item_next ) item_next->_prev_sibling = this;
#else /*FLTK_ABI_VERSION*/
  // OLD
  // -- does nothing --
#endif /*FLTK_ABI_VERSION*/
}